

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# anim_animators.cpp
# Opt level: O3

void Am_Blink_Animator_Animation_proc(Am_Object *interp,Am_Time *elapsed_time)

{
  bool bVar1;
  Am_Wrapper *value;
  Am_Value *pAVar2;
  Am_Value value1;
  Am_Value curr_value;
  Am_Value value2;
  Am_Object local_50;
  Am_Value local_48;
  Am_Value local_38;
  Am_Value local_28;
  
  value = Am_Time::operator_cast_to_Am_Wrapper_(elapsed_time);
  Am_Object::Set(interp,0xea,value,0);
  pAVar2 = Am_Object::Get(interp,0x169,0);
  Am_Value::Am_Value(&local_38,pAVar2);
  pAVar2 = Am_Object::Get(interp,0x181,0);
  Am_Value::Am_Value(&local_48,pAVar2);
  pAVar2 = Am_Object::Get(interp,0x182,0);
  Am_Value::Am_Value(&local_28,pAVar2);
  bVar1 = Am_Value::operator==(&local_38,&local_48);
  pAVar2 = &local_48;
  if (bVar1) {
    pAVar2 = &local_28;
  }
  Am_Object::Set(interp,0x169,pAVar2,0);
  Am_Object::Am_Object(&local_50,interp);
  Am_Set_Animated_Slots(&local_50);
  Am_Object::~Am_Object(&local_50);
  Am_Value::~Am_Value(&local_28);
  Am_Value::~Am_Value(&local_48);
  Am_Value::~Am_Value(&local_38);
  return;
}

Assistant:

Am_Define_Method(Am_Timer_Method, void, Am_Blink_Animator_Animation,
                 (Am_Object interp, const Am_Time &elapsed_time))
{
  interp.Set(Am_ELAPSED_TIME, elapsed_time);

  Am_Value curr_value = interp.Get(Am_VALUE);
  Am_Value value1 = interp.Get(Am_VALUE_1);
  Am_Value value2 = interp.Get(Am_VALUE_2);

  if (curr_value == value1)
    interp.Set(Am_VALUE, value2);
  else
    interp.Set(Am_VALUE, value1);

  Am_Set_Animated_Slots(interp);
}